

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluNativeWindow.cpp
# Opt level: O0

EGLNativeWindowType __thiscall eglu::NativeWindow::getLegacyNative(NativeWindow *this)

{
  deBool dVar1;
  InternalError *this_00;
  NotSupportedError *this_01;
  NativeWindow *this_local;
  
  while( true ) {
    dVar1 = ::deGetFalse();
    if ((dVar1 != 0) || ((this->m_capabilities & CAPABILITY_CREATE_SURFACE_LEGACY) != 0)) break;
    dVar1 = ::deGetFalse();
    if (dVar1 == 0) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_01,"eglu::NativeWindow doesn\'t support eglCreateWindowSurface()",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluNativeWindow.cpp"
                 ,0x29);
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  this_00 = (InternalError *)__cxa_allocate_exception(0x38);
  tcu::InternalError::InternalError
            (this_00,(char *)0x0,"(m_capabilities & CAPABILITY_CREATE_SURFACE_LEGACY) == 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluNativeWindow.cpp"
             ,0x28);
  __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
}

Assistant:

EGLNativeWindowType NativeWindow::getLegacyNative (void)
{
	TCU_CHECK_INTERNAL((m_capabilities & CAPABILITY_CREATE_SURFACE_LEGACY) == 0);
	throw tcu::NotSupportedError("eglu::NativeWindow doesn't support eglCreateWindowSurface()", DE_NULL, __FILE__, __LINE__);
}